

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alist.c
# Opt level: O2

int array_list_add(p_array_list alist,void *item)

{
  int i;
  uint uVar1;
  ulong uVar2;
  size_t sVar3;
  long lVar4;
  void **ppvVar5;
  
  lVar4 = 0;
  uVar2 = 0;
  do {
    if (alist->size == uVar2) {
      sVar3 = expand_array_list(alist);
      uVar1 = (int)(sVar3 >> 1) + 1;
      uVar2 = (ulong)uVar1;
      ppvVar5 = alist->array + (int)uVar1;
LAB_001033bd:
      *ppvVar5 = item;
      alist->count = alist->count + 1;
      return (int)uVar2;
    }
    if (alist->array[uVar2] == (void *)0x0) {
      ppvVar5 = (void **)((long)alist->array - lVar4);
      goto LAB_001033bd;
    }
    uVar2 = uVar2 + 1;
    lVar4 = lVar4 + -8;
  } while( true );
}

Assistant:

int array_list_add(p_array_list alist, void* item) {
    for (int i = 0; i < alist->size; i++) {
        if (alist->array[i] == 0) {
            alist->array[i] = item;
            alist->count++;
            return i;
        }
    }
    int index = (int) ((expand_array_list(alist) / 2) + 1);
    alist->array[index] = item;
    alist->count++;
    return index;
}